

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O2

char * zip_strclone(char *str,size_t n)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = (char *)calloc(n + 1,1);
  if (pcVar1 != (char *)0x0) {
    for (sVar2 = 0; (n != sVar2 && (str[sVar2] != '\0')); sVar2 = sVar2 + 1) {
      pcVar1[sVar2] = str[sVar2];
    }
  }
  return pcVar1;
}

Assistant:

static char *zip_strclone(const char *str, size_t n) {
  char c;
  size_t i;
  char *rpl = (char *)calloc((1 + n), sizeof(char));
  char *begin = rpl;
  if (!rpl) {
    return NULL;
  }

  for (i = 0; (i < n) && (c = *str++); ++i) {
    *rpl++ = c;
  }

  return begin;
}